

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListView::wheelEvent(QListView *this,QWheelEvent *e)

{
  ushort uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  QObject *pQVar14;
  long in_FS_OFFSET;
  QArrayData *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_b8 [2];
  undefined8 local_a8 [2];
  QWheelEvent hwe;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  uVar12 = (uint)((ulong)*(undefined8 *)(e + 0x58) >> 0x20);
  uVar13 = -uVar12;
  if (0 < (int)uVar12) {
    uVar13 = uVar12;
  }
  uVar9 = (uint)*(undefined8 *)(e + 0x58);
  uVar12 = -uVar9;
  if (0 < (int)uVar9) {
    uVar12 = uVar9;
  }
  if (uVar12 < uVar13) {
    if (uVar9 == 0) {
      if (*(int *)(lVar6 + 0x558) == 0) {
        if (*(char *)(lVar6 + 0x548) == '\0') goto LAB_00569e10;
      }
      else if ((*(int *)(lVar6 + 0x558) == 1) && (*(char *)(lVar6 + 0x548) != '\0')) {
LAB_00569e10:
        iVar10 = QAbstractSlider::minimum(*(QAbstractSlider **)(lVar6 + 0x290));
        if ((iVar10 == 0) &&
           (iVar10 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar6 + 0x290)), iVar10 == 0)) {
          uVar7 = *(ulong *)(e + 0x50);
          uVar8 = *(ulong *)(e + 0x58);
          _hwe = &DAT_aaaaaaaaaaaaaaaa;
          local_a8[0] = QEventPoint::position();
          local_b8[0] = QEventPoint::globalPosition();
          uVar2 = *(undefined4 *)(e + 0x20);
          uVar3 = *(undefined4 *)(e + 0x44);
          uVar1 = *(ushort *)(e + 0x4e);
          uVar4 = *(undefined4 *)(e + 0x48);
          local_d8 = (QArrayData *)0x0;
          uStack_d0 = 0;
          local_c8 = 0;
          uVar11 = QPointingDevice::primaryPointingDevice((QString *)&local_d8);
          QWheelEvent::QWheelEvent
                    (&hwe,local_a8,local_b8,uVar7 << 0x20 | uVar7 >> 0x20,
                     uVar8 << 0x20 | uVar8 >> 0x20,uVar3,uVar2,uVar1 >> 0xc & 7,uVar1 >> 0xf,uVar4,
                     uVar11);
          if (local_d8 != (QArrayData *)0x0) {
            LOCK();
            (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_d8,2,0x10);
            }
          }
          if (e[0xb] == (QWheelEvent)0x1) {
            qt_sendSpontaneousEvent(*(QObject **)(lVar6 + 0x288),(QEvent *)&hwe);
          }
          else {
            QCoreApplication::sendEvent(*(QObject **)(lVar6 + 0x288),(QEvent *)&hwe);
          }
          (**(code **)(*(long *)e + 0x10))(e,0xaa);
          QWheelEvent::~QWheelEvent(&hwe);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
            return;
          }
          goto LAB_00569fa3;
        }
      }
    }
    pQVar14 = *(QObject **)(lVar6 + 0x290);
  }
  else {
    pQVar14 = *(QObject **)(lVar6 + 0x288);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    QCoreApplication::sendEvent(pQVar14,(QEvent *)e);
    return;
  }
LAB_00569fa3:
  __stack_chk_fail();
}

Assistant:

void QListView::wheelEvent(QWheelEvent *e)
{
    Q_D(QListView);
    if (qAbs(e->angleDelta().y()) > qAbs(e->angleDelta().x())) {
        if (e->angleDelta().x() == 0
                && ((d->flow == TopToBottom && d->wrap) || (d->flow == LeftToRight && !d->wrap))
                && d->vbar->minimum() == 0 && d->vbar->maximum() == 0) {
            QPoint pixelDelta(e->pixelDelta().y(), e->pixelDelta().x());
            QPoint angleDelta(e->angleDelta().y(), e->angleDelta().x());
            QWheelEvent hwe(e->position(), e->globalPosition(), pixelDelta, angleDelta,
                            e->buttons(), e->modifiers(), e->phase(), e->inverted(), e->source());
            if (e->spontaneous())
                qt_sendSpontaneousEvent(d->hbar, &hwe);
            else
                QCoreApplication::sendEvent(d->hbar, &hwe);
            e->setAccepted(hwe.isAccepted());
        } else {
            QCoreApplication::sendEvent(d->vbar, e);
        }
    } else {
        QCoreApplication::sendEvent(d->hbar, e);
    }
}